

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O2

FExecList * C_ParseCmdLineParams(FExecList *exec)

{
  FString FVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  uint uVar5;
  int arg;
  FString cmdString;
  FString local_38;
  
  iVar2 = 1;
  while (arg = iVar2, iVar2 = DArgs::NumArgs(Args), arg < iVar2) {
    iVar2 = arg + 1;
    pcVar4 = DArgs::GetArg(Args,arg);
    if (*pcVar4 == '+') {
      FString::NullString.RefCount = FString::NullString.RefCount + 1;
      cmdString.Chars = FString::NullString.Nothing;
      uVar5 = 1;
      while (((iVar3 = DArgs::NumArgs(Args), iVar2 < iVar3 &&
              (pcVar4 = DArgs::GetArg(Args,iVar2), *pcVar4 != '-')) &&
             (pcVar4 = DArgs::GetArg(Args,iVar2), *pcVar4 != '+'))) {
        iVar2 = iVar2 + 1;
        uVar5 = uVar5 + 1;
      }
      DArgs::GetArgList(Args,arg);
      BuildString((int)&local_38,(FString *)(ulong)uVar5);
      FString::operator=(&cmdString,&local_38);
      FString::~FString(&local_38);
      FVar1 = cmdString;
      if (*(int *)(cmdString.Chars + -0xc) != 0) {
        if (exec == (FExecList *)0x0) {
          exec = (FExecList *)operator_new(0x20);
          (exec->Pullins).Array = (FString *)0x0;
          (exec->Pullins).Most = 0;
          (exec->Pullins).Count = 0;
          (exec->Commands).Array = (FString *)0x0;
          (exec->Commands).Most = 0;
          (exec->Commands).Count = 0;
        }
        FExecList::AddCommand(exec,FVar1.Chars + 1,(char *)0x0);
      }
      FString::~FString(&cmdString);
    }
  }
  return exec;
}

Assistant:

FExecList *C_ParseCmdLineParams(FExecList *exec)
{
	for (int currArg = 1; currArg < Args->NumArgs(); )
	{
		if (*Args->GetArg (currArg++) == '+')
		{
			FString cmdString;
			int cmdlen = 1;
			int argstart = currArg - 1;

			while (currArg < Args->NumArgs())
			{
				if (*Args->GetArg (currArg) == '-' || *Args->GetArg (currArg) == '+')
					break;
				currArg++;
				cmdlen++;
			}

			cmdString = BuildString (cmdlen, Args->GetArgList (argstart));
			if (!cmdString.IsEmpty())
			{
				if (exec == NULL)
				{
					exec = new FExecList;
				}
				exec->AddCommand(&cmdString[1]);
			}
		}
	}
	return exec;
}